

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_jpgd.cpp
# Opt level: O1

void __thiscall jpgd::jpeg_decoder::read_dqt_marker(jpeg_decoder *this)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  byte *pbVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  jpgd_quant_t *pjVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  ushort uVar13;
  uint uVar14;
  bool bVar15;
  
  iVar2 = this->m_bits_left;
  uVar14 = this->m_bit_buf;
  this->m_bits_left = iVar2 + -0x10;
  if (iVar2 < 0x11) {
    this->m_bit_buf = uVar14 << ((byte)iVar2 & 0x1f);
    if ((this->m_in_buf_left == 0) && (prep_in_buffer(this), this->m_in_buf_left == 0)) {
      uVar11 = this->m_tem_flag;
      this->m_tem_flag = uVar11 ^ 1;
      uVar8 = 0xd9;
      if (uVar11 == 0) {
        uVar8 = 0xff;
      }
    }
    else {
      pbVar5 = this->m_pIn_buf_ofs;
      this->m_pIn_buf_ofs = pbVar5 + 1;
      bVar1 = *pbVar5;
      this->m_in_buf_left = this->m_in_buf_left + -1;
      uVar8 = (uint)bVar1;
    }
    if ((this->m_in_buf_left == 0) && (prep_in_buffer(this), this->m_in_buf_left == 0)) {
      uVar6 = this->m_tem_flag;
      this->m_tem_flag = uVar6 ^ 1;
      uVar11 = 0xd9;
      if (uVar6 == 0) {
        uVar11 = 0xff;
      }
    }
    else {
      pbVar5 = this->m_pIn_buf_ofs;
      this->m_pIn_buf_ofs = pbVar5 + 1;
      uVar11 = (uint)*pbVar5;
      this->m_in_buf_left = this->m_in_buf_left + -1;
    }
    this->m_bit_buf =
         (uVar8 << 8 | (uint)*(ushort *)((long)&this->m_bit_buf + 2) << 0x10 | uVar11) <<
         (-(char)this->m_bits_left & 0x1fU);
    this->m_bits_left = this->m_bits_left + 0x10;
  }
  else {
    this->m_bit_buf = uVar14 << 0x10;
  }
  if (uVar14 < 0x20000) {
    stop_decoding(this,JPGD_BAD_DQT_MARKER);
  }
  uVar14 = (uVar14 >> 0x10) - 2;
  while( true ) {
    if (uVar14 == 0) {
      return;
    }
    iVar2 = this->m_bits_left;
    uVar8 = this->m_bit_buf;
    this->m_bits_left = iVar2 + -8;
    if (iVar2 < 9) {
      this->m_bit_buf = uVar8 << ((byte)iVar2 & 0x1f);
      if ((this->m_in_buf_left == 0) && (prep_in_buffer(this), this->m_in_buf_left == 0)) {
        uVar6 = this->m_tem_flag;
        this->m_tem_flag = uVar6 ^ 1;
        uVar11 = 0xd9;
        if (uVar6 == 0) {
          uVar11 = 0xff;
        }
      }
      else {
        pbVar5 = this->m_pIn_buf_ofs;
        this->m_pIn_buf_ofs = pbVar5 + 1;
        bVar1 = *pbVar5;
        this->m_in_buf_left = this->m_in_buf_left + -1;
        uVar11 = (uint)bVar1;
      }
      if ((this->m_in_buf_left == 0) && (prep_in_buffer(this), this->m_in_buf_left == 0)) {
        uVar10 = this->m_tem_flag;
        this->m_tem_flag = uVar10 ^ 1;
        uVar6 = 0xd9;
        if (uVar10 == 0) {
          uVar6 = 0xff;
        }
      }
      else {
        pbVar5 = this->m_pIn_buf_ofs;
        this->m_pIn_buf_ofs = pbVar5 + 1;
        uVar6 = (uint)*pbVar5;
        this->m_in_buf_left = this->m_in_buf_left + -1;
      }
      this->m_bit_buf =
           (uVar11 << 8 | (uint)*(ushort *)((long)&this->m_bit_buf + 2) << 0x10 | uVar6) <<
           (-(char)this->m_bits_left & 0x1fU);
      this->m_bits_left = this->m_bits_left + 0x10;
    }
    else {
      this->m_bit_buf = uVar8 << 8;
    }
    uVar11 = uVar8 >> 0x18 & 0xf;
    if (3 < uVar11) break;
    if (this->m_quant[uVar11] == (jpgd_quant_t *)0x0) {
      pjVar9 = (jpgd_quant_t *)alloc(this,0x80,false);
      this->m_quant[uVar11] = pjVar9;
    }
    lVar12 = 0;
    do {
      iVar2 = this->m_bits_left;
      uVar6 = this->m_bit_buf;
      this->m_bits_left = iVar2 + -8;
      if (iVar2 < 9) {
        this->m_bit_buf = uVar6 << ((byte)iVar2 & 0x1f);
        if ((this->m_in_buf_left == 0) && (prep_in_buffer(this), this->m_in_buf_left == 0)) {
          uVar7 = this->m_tem_flag;
          this->m_tem_flag = uVar7 ^ 1;
          uVar10 = 0xd9;
          if (uVar7 == 0) {
            uVar10 = 0xff;
          }
        }
        else {
          pbVar5 = this->m_pIn_buf_ofs;
          this->m_pIn_buf_ofs = pbVar5 + 1;
          bVar1 = *pbVar5;
          this->m_in_buf_left = this->m_in_buf_left + -1;
          uVar10 = (uint)bVar1;
        }
        if ((this->m_in_buf_left == 0) && (prep_in_buffer(this), this->m_in_buf_left == 0)) {
          uVar4 = this->m_tem_flag;
          this->m_tem_flag = uVar4 ^ 1;
          uVar7 = 0xd9;
          if (uVar4 == 0) {
            uVar7 = 0xff;
          }
        }
        else {
          pbVar5 = this->m_pIn_buf_ofs;
          this->m_pIn_buf_ofs = pbVar5 + 1;
          uVar7 = (uint)*pbVar5;
          this->m_in_buf_left = this->m_in_buf_left + -1;
        }
        this->m_bit_buf =
             (uVar10 << 8 | (uint)*(ushort *)((long)&this->m_bit_buf + 2) << 0x10 | uVar7) <<
             (-(char)this->m_bits_left & 0x1fU);
        this->m_bits_left = this->m_bits_left + 0x10;
      }
      else {
        this->m_bit_buf = uVar6 << 8;
      }
      uVar13 = (ushort)(byte)(uVar6 >> 0x18);
      if (0xfffffff < uVar8) {
        iVar2 = this->m_bits_left;
        uVar3 = this->m_bit_buf;
        this->m_bits_left = iVar2 + -8;
        if (iVar2 < 9) {
          this->m_bit_buf = uVar3 << ((byte)iVar2 & 0x1f);
          if ((this->m_in_buf_left == 0) && (prep_in_buffer(this), this->m_in_buf_left == 0)) {
            uVar7 = this->m_tem_flag;
            this->m_tem_flag = uVar7 ^ 1;
            uVar10 = 0xd9;
            if (uVar7 == 0) {
              uVar10 = 0xff;
            }
          }
          else {
            pbVar5 = this->m_pIn_buf_ofs;
            this->m_pIn_buf_ofs = pbVar5 + 1;
            bVar1 = *pbVar5;
            this->m_in_buf_left = this->m_in_buf_left + -1;
            uVar10 = (uint)bVar1;
          }
          if ((this->m_in_buf_left == 0) && (prep_in_buffer(this), this->m_in_buf_left == 0)) {
            uVar4 = this->m_tem_flag;
            this->m_tem_flag = uVar4 ^ 1;
            uVar7 = 0xd9;
            if (uVar4 == 0) {
              uVar7 = 0xff;
            }
          }
          else {
            pbVar5 = this->m_pIn_buf_ofs;
            this->m_pIn_buf_ofs = pbVar5 + 1;
            uVar7 = (uint)*pbVar5;
            this->m_in_buf_left = this->m_in_buf_left + -1;
          }
          this->m_bit_buf =
               (uVar10 << 8 | (uint)*(ushort *)((long)&this->m_bit_buf + 2) << 0x10 | uVar7) <<
               (-(char)this->m_bits_left & 0x1fU);
          this->m_bits_left = this->m_bits_left + 0x10;
        }
        else {
          this->m_bit_buf = uVar3 << 8;
        }
        uVar13 = (ushort)((uVar6 >> 0x18) << 8) | (ushort)(byte)(uVar3 >> 0x18);
      }
      this->m_quant[uVar11][lVar12] = uVar13;
      lVar12 = lVar12 + 1;
    } while (lVar12 != 0x40);
    uVar8 = (uint)(0xfffffff < uVar8) * 0x40 + 0x41;
    bVar15 = uVar14 < uVar8;
    uVar14 = uVar14 - uVar8;
    if (bVar15) {
      stop_decoding(this,JPGD_BAD_DQT_LENGTH);
    }
  }
  stop_decoding(this,JPGD_BAD_DQT_TABLE);
}

Assistant:

void jpeg_decoder::read_dqt_marker() {
  int n, i, prec;
  uint num_left;
  uint temp;

  num_left = get_bits(16);

  if (num_left < 2)
    stop_decoding(JPGD_BAD_DQT_MARKER);

  num_left -= 2;

  while (num_left) {
    n = get_bits(8);
    prec = n >> 4;
    n &= 0x0F;

    if (n >= JPGD_MAX_QUANT_TABLES)
      stop_decoding(JPGD_BAD_DQT_TABLE);

    if (!m_quant[n])
      m_quant[n] = (jpgd_quant_t*)alloc(64 * sizeof(jpgd_quant_t));

    // read quantization entries, in zag order
    for (i = 0; i < 64; i++) {
      temp = get_bits(8);

      if (prec)
        temp = (temp << 8) + get_bits(8);

      m_quant[n][i] = static_cast<jpgd_quant_t>(temp);
    }

    i = 64 + 1;

    if (prec)
      i += 64;

    if (num_left < (uint)i)
      stop_decoding(JPGD_BAD_DQT_LENGTH);

    num_left -= i;
  }
}